

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile.cpp
# Opt level: O0

void __thiscall LogFile::GetFileName(LogFile *this,time_t nowTime,string *sLogName)

{
  tm *__tp;
  char *__s;
  size_t __maxsize;
  tm *stTime;
  string *sLogName_local;
  time_t nowTime_local;
  LogFile *this_local;
  
  sLogName_local = (string *)nowTime;
  nowTime_local = (time_t)this;
  __tp = gmtime((time_t *)&sLogName_local);
  std::__cxx11::string::resize((ulong)sLogName);
  __s = (char *)std::__cxx11::string::data();
  __maxsize = std::__cxx11::string::capacity();
  strftime(__s,__maxsize,"%Y%m%d-%H%M%S.log",__tp);
  return;
}

Assistant:

void LogFile::GetFileName(time_t nowTime, std::string & sLogName)
{
	struct tm * stTime = gmtime(&nowTime);
	sLogName.resize(19);
	strftime(const_cast<char *> (sLogName.data()), sLogName.capacity(), "%Y%m%d-%H%M%S.log", stTime);
}